

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  long lVar1;
  pointer ppFVar2;
  bool bVar3;
  int iVar4;
  Reflection *this_00;
  UnknownFieldSet *this_01;
  Descriptor *pDVar5;
  MapFieldBase *this_02;
  Message *pMVar6;
  pointer ppFVar7;
  int index;
  MapIterator iter;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator end;
  MapIterator local_e0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_98;
  MapIterator local_78;
  
  this_00 = GetReflectionOrDie(message);
  this_01 = Reflection::MutableUnknownFields(this_00,message);
  if ((this_01->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_01->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    UnknownFieldSet::ClearFallback(this_01);
  }
  local_98.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&local_98);
  ppFVar2 = local_98.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar7 = local_98.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar7 == ppFVar2) {
      if (local_98.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    this = *ppFVar7;
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_e0.iter_ = FieldDescriptor::TypeOnceInit;
      local_78.iter_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,
                 (FieldDescriptor **)&local_78);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) == 10) {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_e0.iter_ = FieldDescriptor::TypeOnceInit;
        local_78.iter_ = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,
                   (FieldDescriptor **)&local_78);
      }
      if ((this[2] == (FieldDescriptor)0xb) &&
         (bVar3 = FieldDescriptor::is_map_message_type(this), bVar3)) {
        pDVar5 = FieldDescriptor::message_type(this);
        lVar1 = *(long *)(pDVar5 + 0x28);
        if (*(once_flag **)(lVar1 + 0x60) != (once_flag *)0x0) {
          local_78.iter_ = (void *)(lVar1 + 0x48);
          local_e0.iter_ = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(lVar1 + 0x60),(_func_void_FieldDescriptor_ptr **)&local_e0,
                     (FieldDescriptor **)&local_78);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(lVar1 + 0x4a) * 4) == 10)
        {
          this_02 = Reflection::MutableMapData(this_00,message,this);
          bVar3 = MapFieldBase::IsMapValid(this_02);
          if (bVar3) {
            MapIterator::MapIterator(&local_e0,message,this);
            MapIterator::MapIterator(&local_78,message,this);
            (*this_02->_vptr_MapFieldBase[7])(this_02,&local_e0);
            (*this_02->_vptr_MapFieldBase[8])(this_02,&local_78);
            while (iVar4 = (*(local_e0.map_)->_vptr_MapFieldBase[6])
                                     (local_e0.map_,&local_e0,&local_78), (char)iVar4 == '\0') {
              MapFieldBase::SetMapDirty(local_e0.map_);
              pMVar6 = MapValueRef::MutableMessageValue(&local_e0.value_);
              Message::DiscardUnknownFields(pMVar6);
              (*(local_e0.map_)->_vptr_MapFieldBase[0x14])(local_e0.map_,&local_e0);
            }
            MapIterator::~MapIterator(&local_78);
            MapIterator::~MapIterator(&local_e0);
          }
          goto LAB_003b57da;
        }
      }
      if ((~(byte)this[1] & 0x60) == 0) {
        iVar4 = Reflection::FieldSize(this_00,message,this);
        if (0 < iVar4) {
          index = 0;
          do {
            pMVar6 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
            Message::DiscardUnknownFields(pMVar6);
            index = index + 1;
          } while (iVar4 != index);
        }
      }
      else {
        pMVar6 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
        Message::DiscardUnknownFields(pMVar6);
      }
    }
LAB_003b57da:
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}